

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O0

uint load_memory_dump_v2(uint pfx,mmt_memory_dump_v2_prefix **dump,mmt_buf **buf)

{
  uint32_t uVar1;
  char *pcVar2;
  mmt_memory_dump_v2_prefix *pmVar3;
  mmt_buf *pmVar4;
  mmt_message *msg;
  mmt_buf *b;
  mmt_memory_dump_v2_prefix *d;
  uint size2;
  uint size1;
  mmt_buf **buf_local;
  mmt_memory_dump_v2_prefix **dump_local;
  uint pfx_local;
  
  *dump = (mmt_memory_dump_v2_prefix *)0x0;
  *buf = (mmt_buf *)0x0;
  pcVar2 = (char *)mmt_load_data_with_prefix(1,pfx,1);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'y')) {
    dump_local._4_4_ = 0;
  }
  else {
    pmVar3 = (mmt_memory_dump_v2_prefix *)mmt_load_data_with_prefix(9,pfx,0);
    pmVar4 = (mmt_buf *)mmt_load_data_with_prefix(4,pfx + 9,0);
    mmt_buf_check_sanity(pmVar4);
    uVar1 = pmVar4->len;
    pmVar4 = (mmt_buf *)mmt_load_data_with_prefix(uVar1 + 5,pfx + 9,0);
    mmt_check_eor(uVar1 + 0xe + pfx);
    *dump = pmVar3;
    *buf = pmVar4;
    dump_local._4_4_ = uVar1 + 0xe;
  }
  return dump_local._4_4_;
}

Assistant:

static unsigned int load_memory_dump_v2(unsigned int pfx, struct mmt_memory_dump_v2_prefix **dump, struct mmt_buf **buf)
{
	unsigned int size1, size2;
	struct mmt_memory_dump_v2_prefix *d;
	struct mmt_buf *b;
	*dump = NULL;
	*buf = NULL;

	struct mmt_message *msg = mmt_load_data_with_prefix(1, pfx, 1);
	if (msg == NULL || msg->type != 'y')
		return 0;

	size1 = sizeof(struct mmt_memory_dump_v2_prefix);
	d = mmt_load_data_with_prefix(size1, pfx, 0);

	size2 = 4;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);
	mmt_buf_check_sanity(b);
	size2 += b->len + 1;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);

	mmt_check_eor(size2 + size1 + pfx);

	*dump = d;
	*buf = b;

	return size1 + size2;
}